

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpolynomial.cpp
# Opt level: O2

int __thiscall TPZPolynomial::SetRoots(TPZPolynomial *this)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REAL RVar11;
  TPZManVector<double,_3> X;
  
  TPZManVector<double,_3>::TPZManVector(&X,3);
  pdVar1 = (this->fCo).fStore;
  dVar7 = this->fTolerance;
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    iVar4 = iVar4 + (uint)(ABS(pdVar1[lVar3]) < dVar7);
  }
  if (iVar4 == 4) {
    pdVar1 = (this->fReal).fStore;
    iVar4 = 1;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = 0.0;
    }
  }
  else {
    if ((dVar7 <= ABS(*pdVar1)) || (dVar7 <= ABS(pdVar1[1]))) {
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        X.super_TPZVec<double>.fStore[lVar3] = -99.999;
      }
      dVar7 = pdVar1[2] + 1.0;
      uVar5 = 0;
      while ((int)uVar5 < 10000) {
        dVar9 = pdVar1[2];
        dVar8 = pdVar1[3] * 3.0 * dVar7 * dVar7 + (dVar9 + dVar9) * dVar7 + pdVar1[1];
        dVar10 = this->fTolerance;
        if (dVar10 <= ABS(dVar8)) {
          uVar5 = uVar5 + 1;
          dVar9 = dVar7 - (pdVar1[1] * dVar7 +
                           pdVar1[3] * dVar7 * dVar7 * dVar7 + dVar9 * dVar7 * dVar7 + *pdVar1) /
                          dVar8;
          *X.super_TPZVec<double>.fStore = dVar9;
          dVar10 = this->fTolerance;
        }
        else {
          dVar9 = *X.super_TPZVec<double>.fStore;
          uVar5 = 0x2712;
        }
        dVar8 = dVar7 - dVar9;
        dVar7 = dVar9;
        if (ABS(dVar8) <= dVar10) {
          uVar5 = 0x2711;
        }
      }
      if ((uVar5 & 0x7ffffffd) == 10000) {
        dVar7 = dVar7 * -100000.0;
        uVar5 = 0;
        while ((int)uVar5 < 10000) {
          dVar9 = pdVar1[2];
          dVar10 = pdVar1[3] * 3.0 * dVar7 * dVar7 + (dVar9 + dVar9) * dVar7 + pdVar1[1];
          RVar11 = this->fTolerance;
          if (ABS(dVar10) <= RVar11) {
            dVar9 = *X.super_TPZVec<double>.fStore;
            uVar5 = 0x2712;
          }
          else {
            uVar5 = uVar5 + 1;
            dVar9 = dVar7 - (pdVar1[1] * dVar7 +
                             pdVar1[3] * dVar7 * dVar7 * dVar7 + dVar9 * dVar7 * dVar7 + *pdVar1) /
                            dVar10;
            *X.super_TPZVec<double>.fStore = dVar9;
            RVar11 = this->fTolerance;
          }
          dVar10 = dVar7 - dVar9;
          dVar7 = dVar9;
          if (ABS(dVar10) <= RVar11) {
            uVar5 = 0x3e9;
          }
        }
      }
      if ((uVar5 & 0x7ffffffd) == 10000) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
        std::operator<<(poVar2,"\n");
        iVar4 = -1;
        goto LAB_00c052f8;
      }
      dVar7 = pdVar1[3];
      dVar9 = *X.super_TPZVec<double>.fStore;
      dVar10 = pdVar1[2];
      dVar8 = *pdVar1;
      dVar6 = pdVar1[1];
      std::operator<<((ostream *)&std::cout,"Resultado da 1a raiz na equacao");
      poVar2 = std::ostream::_M_insert<double>
                         (dVar8 + dVar6 * dVar9 + dVar7 * dVar9 * dVar9 * dVar9 + dVar10 * dVar9);
      std::operator<<(poVar2,"\n");
      pdVar1 = (this->fCo).fStore;
      dVar7 = pdVar1[3];
      dVar9 = *X.super_TPZVec<double>.fStore * dVar7 + pdVar1[2];
      dVar8 = *X.super_TPZVec<double>.fStore * dVar9 + pdVar1[1];
      dVar10 = dVar9 * dVar9 + dVar8 * -4.0 * dVar7;
      if (0.0 <= dVar10) {
        dVar6 = SQRT(dVar10);
        dVar8 = dVar6;
        if (dVar10 < 0.0) {
          dVar8 = sqrt(dVar10);
        }
        X.super_TPZVec<double>.fStore[1] = (-dVar9 - dVar8) / (dVar7 + dVar7);
        if (dVar10 < 0.0) {
          dVar6 = sqrt(dVar10);
        }
        X.super_TPZVec<double>.fStore[2] = (dVar6 - dVar9) / (dVar7 + dVar7);
      }
      else {
        std::operator<<((ostream *)&std::cerr,
                        "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =");
        poVar2 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar2,"\t");
        poVar2 = std::ostream::_M_insert<double>(*X.super_TPZVec<double>.fStore);
        std::operator<<(poVar2,"\n");
        poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[3]);
        std::operator<<(poVar2,"x >= + ");
        poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[2]);
        std::operator<<(poVar2,"x <= + ");
        poVar2 = std::ostream::_M_insert<double>((this->fCo).fStore[1]);
        std::operator<<(poVar2,"x + ");
        poVar2 = std::ostream::_M_insert<double>(*(this->fCo).fStore);
        std::operator<<(poVar2," = 0.0\n");
        poVar2 = std::ostream::_M_insert<double>(dVar7);
        std::operator<<(poVar2,"x<= + ");
        poVar2 = std::ostream::_M_insert<double>(dVar9);
        std::operator<<(poVar2,"x + ");
        poVar2 = std::ostream::_M_insert<double>(dVar8);
        std::operator<<(poVar2," = 0.0\n");
        X.super_TPZVec<double>.fStore[1] = 0.0;
        X.super_TPZVec<double>.fStore[2] = 0.0;
      }
      std::__sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (X.super_TPZVec<double>.fStore,X.super_TPZVec<double>.fStore + 3);
      TPZVec<double>::operator=(&this->fReal,&X.super_TPZVec<double>);
    }
    else {
      *X.super_TPZVec<double>.fStore = pdVar1[2] / pdVar1[3];
      X.super_TPZVec<double>.fStore[1] = 0.0;
      X.super_TPZVec<double>.fStore[2] = 0.0;
      std::__sort<double*,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (X.super_TPZVec<double>.fStore,X.super_TPZVec<double>.fStore + 3);
      TPZVec<double>::operator=(&this->fReal,&X.super_TPZVec<double>);
    }
    iVar4 = 1;
  }
LAB_00c052f8:
  TPZManVector<double,_3>::~TPZManVector(&X);
  return iVar4;
}

Assistant:

int TPZPolynomial::SetRoots() {
    TPZManVector<REAL,3> X(3);
	REAL x;
    REAL tol = -99.999;
    REAL der;
    int i, j;
    int zero = 0;
    for (i = 0; i < 4; i++)
        if (fabs(fCo[i]) < fTolerance) zero++;
    if (zero == 4) {
        for (i = 0; i < 3; i++) fReal[i] = 0.000;
        return 1;
    }
    else {
        if (fabs(fCo[0]) < fTolerance && fabs(fCo[1]) < fTolerance) {
            X[0] = fCo[2] / fCo[3];
            X[1] = 0.0;
            X[2] = 0.0;
			sort(&X[0], &X[3], greater<REAL>());
			fReal = X;
//			copy(&X[0], &X[3], &fReal[0]);
        }
        else {
            // Primeira aproximacao
            for (i = 0; i < 3; i++) X[i] = -99.999;
            x = fCo[2] + 1.0;
            j = 0;
            while (j < 10000) {
                j++;
                der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                if (fabs(der) < fTolerance) j = 10002;
                else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                tol = fabs(x - X[0]);
                if (tol <= fTolerance) j = 10001;
                x = X[0];
            }
            //Caso falhe a primeira aproxima��o
            if (j == 10002 || j == 10000) {
                x = -1e5 * x;
                j = 0;
                while (j < 10000) {
                    j++;
                    der = 3.0 * fCo[3] * x * x + 2.0 * fCo[2] * x + fCo[1];
                    if (fabs(der) <= fTolerance) j = 10002;
                    else X[0] = x - ((fCo[3] * x * x * x + fCo[2] * x * x + fCo[1] * x + fCo[0]) / der);
                    tol = fabs(x - X[0]);
                    if (tol <= fTolerance) j = 1001;
                    x = X[0];
                }
            }
            if (j == 10002 || j == 10000) {
                cout << "TPZPolynomial::SetRoots().\nErro no calculo das raizes!!!!! j= " << j << "\n";
                return -1;
            }
            REAL teste;
            teste = fCo[3] * X[0] * X[0] * X[0] + fCo[2] * X[0] + fCo[1] * X[0] + fCo[0];
            cout << "Resultado da 1a raiz na equacao" << teste << "\n";
            //Fim do calculo da primeira raiz (X[0])
            //Reducao da equacao caracteristica de grau 2.
			REAL  b1, b2, b3;
			b3 = fCo[3];
			b2 = fCo[2] + X[0] * b3;
			b1 = fCo[1] + X[0] * b2;
			
            /** Calculo das outras duas raizes (X[1] e X[2]) b3*x^2 + b2*x + b1 = 0 */
            REAL delta;
            delta = b2 * b2 - 4.0 * b1 * b3;
            if (delta < 0.0) {
                cerr << "TPZPolynomial::SetRoots() - warning: Raizes nao reais!! Delta =" << delta << "\t" << X[0] << "\n";
                cout << fCo[3] << "x >= + " << fCo[2] << "x <= + " << fCo[1] << "x + " << fCo[0] << " = 0.0\n";
                cout << b3 << "x<= + " << b2 << "x + " << b1 << " = 0.0\n";
                X[1] = 0.0;
                X[2] = 0.0;
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
            else {
                X[1] = (-b2 - sqrt(delta)) / (2.0 * b3);
                X[2] = (-b2 + sqrt(delta)) / (2.0 * b3);
                // Ordenando as tensoes de forma crescente
                sort(&X[0], &X[3], greater<REAL>());
				fReal = X;
            }
        }
    }
    return 1;
}